

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  Status SVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  string local_13a0;
  AssertHelper local_1380;
  Message local_1378;
  bool local_1369;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1338;
  Message local_1330;
  bool local_1321;
  undefined1 local_1320 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_12f0;
  Message local_12e8;
  bool local_12d9;
  undefined1 local_12d8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_12a8;
  Message local_12a0;
  bool local_1291;
  undefined1 local_1290 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_1260;
  Message local_1258;
  BorderRouterId local_1250;
  bool local_1249;
  undefined1 local_1248 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_1218;
  Message local_1210;
  BorderRouterId local_1208;
  bool local_1201;
  undefined1 local_1200 [8];
  AssertionResult gtest_ar__7;
  BorderRouter returnValue;
  AssertHelper local_1048;
  Message local_1040;
  bool local_1031;
  undefined1 local_1030 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1000;
  Message local_ff8;
  UnixTime local_ff0;
  allocator local_fe1;
  string local_fe0;
  allocator local_fb9;
  string local_fb8;
  allocator<unsigned_char> local_f93;
  uchar local_f92 [2];
  iterator local_f90;
  size_type local_f88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f80;
  allocator local_f61;
  string local_f60;
  Timestamp local_f40;
  allocator local_f31;
  string local_f30;
  allocator local_f09;
  string local_f08;
  allocator local_ee1;
  string local_ee0;
  State local_ec0;
  allocator local_eb9;
  string local_eb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e98;
  allocator local_e79;
  string local_e78;
  BorderAgent local_e58;
  NetworkId local_ce0;
  BorderRouterId local_cdc;
  BorderRouter local_cd8;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_b18;
  Message local_b10;
  bool local_b01;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_ad0;
  Message local_ac8;
  UnixTime local_ac0;
  allocator local_ab1;
  string local_ab0;
  allocator local_a89;
  string local_a88;
  allocator<unsigned_char> local_a63;
  uchar local_a62 [2];
  iterator local_a60;
  size_type local_a58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a50;
  allocator local_a31;
  string local_a30;
  Timestamp local_a10;
  allocator local_a01;
  string local_a00;
  allocator local_9d9;
  string local_9d8;
  allocator local_9b1;
  string local_9b0;
  State local_990;
  allocator local_989;
  string local_988;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_968;
  allocator local_949;
  string local_948;
  BorderAgent local_928;
  NetworkId local_7b0;
  BorderRouterId local_7ac;
  BorderRouter local_7a8;
  bool local_619;
  undefined1 local_618 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_5e8;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_5a0;
  Message local_598;
  UnixTime local_590;
  allocator local_581;
  string local_580;
  allocator local_559;
  string local_558;
  allocator<unsigned_char> local_533;
  uchar local_532 [2];
  iterator local_530;
  size_type local_528;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_520;
  allocator local_501;
  string local_500;
  Timestamp local_4e0;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  State local_460;
  allocator local_459;
  string local_458;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_438;
  allocator local_419;
  string local_418;
  BorderAgent local_3f8;
  NetworkId local_280;
  BorderRouterId local_27c;
  BorderRouter local_278;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_d0 [4];
  BorderRouterId newId;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  PersistentStorageJson psj;
  PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test *this_local;
  
  psj.mStorageLock.mPlatform = (sem_t *)this;
  unlink("./tmp/test.tmp");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"./tmp/test.tmp",&local_71);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            ((PersistentStorageJson *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open
                    ((PersistentStorageJson *)local_50);
  local_99 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_98,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x182,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_27c,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_280,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"1.1.1.2",&local_419);
  local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"th1.x",&local_459);
  ot::commissioner::BorderAgent::State::State(&local_460,1,0,1,0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"NetworkId",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"vendor_name",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"model_name",&local_4d1);
  local_4e0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"vendor_data",&local_501);
  local_532[0] = '\x01';
  local_532[1] = 2;
  local_530 = local_532;
  local_528 = 2;
  std::allocator<unsigned_char>::allocator(&local_533);
  __l_01._M_len = local_528;
  __l_01._M_array = local_530;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_520,__l_01,&local_533);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_558,"Domain_name",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,anon_var_dwarf_36a810 + 9,&local_581);
  ot::commissioner::UnixTime::UnixTime(&local_590,0);
  pcVar3 = (char *)(ulong)(uint)local_460;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_3f8,&local_418,0xb,&local_438,&local_458,local_460,&local_480,0x1011223344556677
             ,&local_4a8,&local_4d0,local_4e0,1,&local_500,&local_520,&local_558,'\0',0,&local_580,
             local_590,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&local_278,&local_27c,&local_280,&local_3f8);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_278,
                     (BorderRouterId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_e9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_278);
  ot::commissioner::BorderAgent::~BorderAgent(&local_3f8);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_520);
  std::allocator<unsigned_char>::~allocator(&local_533);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_e8,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.2\", 11, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x18b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_5d1 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar2) {
    testing::Message::Message(&local_5e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_5d0,
               (AssertionResult *)"newId.mId == 0","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x18c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_7ac,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_7b0,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_948,"1.1.1.3",&local_949);
  local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_968);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_988,"th1.x",&local_989);
  ot::commissioner::BorderAgent::State::State(&local_990,1,0,1,0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9b0,"NetworkId",&local_9b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d8,"vendor_name",&local_9d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a00,"model_name",&local_a01);
  local_a10 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a30,"vendor_data",&local_a31);
  local_a62[0] = '\x01';
  local_a62[1] = 2;
  local_a60 = local_a62;
  local_a58 = 2;
  std::allocator<unsigned_char>::allocator(&local_a63);
  __l_00._M_len = local_a58;
  __l_00._M_array = local_a60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a50,__l_00,&local_a63);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a88,"Domain_name",&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ab0,anon_var_dwarf_36a810 + 9,&local_ab1);
  ot::commissioner::UnixTime::UnixTime(&local_ac0,0);
  pcVar3 = (char *)(ulong)(uint)local_990;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_928,&local_948,0xc,&local_968,&local_988,local_990,&local_9b0,0x1011223344556677
             ,&local_9d8,&local_a00,local_a10,1,&local_a30,&local_a50,&local_a88,'\0',0,&local_ab0,
             local_ac0,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&local_7a8,&local_7ac,&local_7b0,&local_928);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_7a8,
                     (BorderRouterId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_619 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_618,&local_619,(type *)0x0);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_7a8);
  ot::commissioner::BorderAgent::~BorderAgent(&local_928);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a50);
  std::allocator<unsigned_char>::~allocator(&local_a63);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar2) {
    testing::Message::Message(&local_ac8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_618,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.3\", 12, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x192,pcVar4);
    testing::internal::AssertHelper::operator=(&local_ad0,&local_ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_ad0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  local_b01 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b00,&local_b01,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
  if (!bVar2) {
    testing::Message::Message(&local_b10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_b00,
               (AssertionResult *)"newId.mId == 1","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b18,&local_b10);
    testing::internal::AssertHelper::~AssertHelper(&local_b18);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_cdc,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_ce0,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e78,"1.1.1.4",&local_e79);
  local_e98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_eb8,"th1.x",&local_eb9);
  ot::commissioner::BorderAgent::State::State(&local_ec0,1,0,1,0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ee0,"NetworkId",&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f08,"vendor_name",&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f30,"model_name",&local_f31);
  local_f40 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f60,"vendor_data",&local_f61);
  local_f92[0] = '\x01';
  local_f92[1] = 2;
  local_f90 = local_f92;
  local_f88 = 2;
  std::allocator<unsigned_char>::allocator(&local_f93);
  __l._M_len = local_f88;
  __l._M_array = local_f90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f80,__l,&local_f93);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fb8,"Domain_name",&local_fb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fe0,anon_var_dwarf_36a810 + 9,&local_fe1);
  ot::commissioner::UnixTime::UnixTime(&local_ff0,0);
  pcVar3 = (char *)(ulong)(uint)local_ec0;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_e58,&local_e78,0xd,&local_e98,&local_eb8,local_ec0,&local_ee0,0x1011223344556677
             ,&local_f08,&local_f30,local_f40,1,&local_f60,&local_f80,&local_fb8,'\0',0,&local_fe0,
             local_ff0,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&local_cd8,&local_cdc,&local_ce0,&local_e58);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_cd8,
                     (BorderRouterId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_b49 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_cd8);
  ot::commissioner::BorderAgent::~BorderAgent(&local_e58);
  std::__cxx11::string::~string((string *)&local_fe0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f80);
  std::allocator<unsigned_char>::~allocator(&local_f93);
  std::__cxx11::string::~string((string *)&local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_f31);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e98);
  std::__cxx11::string::~string((string *)&local_e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_e79);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar2) {
    testing::Message::Message(&local_ff8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_b48,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.4\", 13, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1000,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x199,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1000,&local_ff8);
    testing::internal::AssertHelper::~AssertHelper(&local_1000);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_ff8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  local_1031 = gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_ == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1030,&local_1031,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1030);
  if (!bVar2) {
    testing::Message::Message(&local_1040);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue.mAgent.mPresentFlags,(internal *)local_1030,
               (AssertionResult *)"newId.mId == 2","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1048,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1048,&local_1040);
    testing::internal::AssertHelper::~AssertHelper(&local_1048);
    std::__cxx11::string::~string((string *)&returnValue.mAgent.mPresentFlags);
    testing::Message::~Message(&local_1040);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1030);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_1208,3);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    ((PersistentStorageJson *)local_50,(RegistrarId *)&local_1208,
                     (BorderRouter *)&gtest_ar__7.message_);
  local_1201 = SVar1 == kNotFound;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1200,&local_1201,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1200);
  if (!bVar2) {
    testing::Message::Message(&local_1210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_1200,
               (AssertionResult *)
               "psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1218,&local_1210);
    testing::internal::AssertHelper::~AssertHelper(&local_1218);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1200);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_1250,1);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    ((PersistentStorageJson *)local_50,(RegistrarId *)&local_1250,
                     (BorderRouter *)&gtest_ar__7.message_);
  local_1249 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1248,&local_1249,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1248);
  if (!bVar2) {
    testing::Message::Message(&local_1258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_1248,
               (AssertionResult *)
               "psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1260,&local_1258);
    testing::internal::AssertHelper::~AssertHelper(&local_1260);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1248);
  local_1291 = (int)returnValue._vptr_BorderRouter == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1290,&local_1291,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1290);
  if (!bVar2) {
    testing::Message::Message(&local_12a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1290,
               (AssertionResult *)"returnValue.mId.mId == 1","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_12a8,&local_12a0);
    testing::internal::AssertHelper::~AssertHelper(&local_12a8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_12a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1290);
  local_12d9 = returnValue.mAgent.mAddr.field_2._8_2_ == 0xc;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12d8,&local_12d9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12d8);
  if (!bVar2) {
    testing::Message::Message(&local_12e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_12d8,
               (AssertionResult *)"returnValue.mAgent.mPort == 12","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_12f0,&local_12e8);
    testing::internal::AssertHelper::~AssertHelper(&local_12f0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_12e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12d8);
  local_1321 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &returnValue.mAgent,"1.1.1.3");
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1320,&local_1321,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1320);
  if (!bVar2) {
    testing::Message::Message(&local_1330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1320,
               (AssertionResult *)"returnValue.mAgent.mAddr == \"1.1.1.3\"","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1338,&local_1330);
    testing::internal::AssertHelper::~AssertHelper(&local_1338);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_1330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1320);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close
                    ((PersistentStorageJson *)local_50);
  local_1369 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1368,&local_1369,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1368);
  if (!bVar2) {
    testing::Message::Message(&local_1378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13a0,(internal *)local_1368,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1380,&local_1378);
    testing::internal::AssertHelper::~AssertHelper(&local_1380);
    std::__cxx11::string::~string((string *)&local_13a0);
    testing::Message::~Message(&local_1378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
            ((PersistentStorageJson *)local_50);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetBorderRouterNotEmpty)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    BorderRouterId newId;

    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.2", 11, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.3", 12, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.4", 13, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    BorderRouter returnValue;

    EXPECT_TRUE(psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAgent.mPort == 12);
    EXPECT_TRUE(returnValue.mAgent.mAddr == "1.1.1.3");

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}